

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZlibWriter.cpp
# Opt level: O2

void __thiscall ZlibWriter::~ZlibWriter(ZlibWriter *this)

{
  ~ZlibWriter(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

ZlibWriter::~ZlibWriter()
{
	deflateEnd(&z);
}